

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_kgc(LexState *ls,GCproto *pt,MSize sizekgc)

{
  uint32_t uVar1;
  MSize len_00;
  uint32_t uVar2;
  lua_State *L_00;
  uint8_t *lenx;
  GCstr *pGVar3;
  GCtab *pGVar4;
  void *pvVar5;
  uint in_EDX;
  long in_RSI;
  LexState *in_RDI;
  lua_State *L;
  TValue *p_1;
  GCcdata *cd;
  CTSize sz;
  CTypeID id;
  char *p;
  MSize len;
  MSize tp;
  GCRef *kr;
  MSize i;
  GCcdata *cd_1;
  undefined2 local_6c;
  lua_State *in_stack_ffffffffffffff98;
  LexState *in_stack_ffffffffffffffa0;
  uint uVar6;
  
  L_00 = (lua_State *)((ulong)*(uint *)(in_RSI + 0x10) + (ulong)in_EDX * -4);
  for (uVar6 = 0; uVar6 < in_EDX; uVar6 = uVar6 + 1) {
    uVar1 = bcread_uleb128(in_RDI);
    if (uVar1 < 5) {
      if (uVar1 == 1) {
        pGVar4 = bcread_ktab((LexState *)CONCAT44(in_EDX,uVar6));
        (L_00->nextgc).gcptr32 = (uint32_t)pGVar4;
      }
      else if (uVar1 == 0) {
        in_stack_ffffffffffffff98 = in_RDI->L;
        if (in_stack_ffffffffffffff98->top <=
            (TValue *)((ulong)(in_stack_ffffffffffffff98->stack).ptr32 + (long)in_RDI->lastline)) {
          bcread_error(in_stack_ffffffffffffffa0,(ErrMsg)((ulong)in_stack_ffffffffffffff98 >> 0x20))
          ;
        }
        in_stack_ffffffffffffff98->top = in_stack_ffffffffffffff98->top + -1;
        (L_00->nextgc).gcptr32 = (uint32_t)(in_stack_ffffffffffffff98->top->field_2).field_0;
      }
      else {
        if (uVar1 == 4) {
          local_6c = 0x10;
        }
        else {
          local_6c = 0xc;
          if (uVar1 == 2) {
            local_6c = 0xb;
          }
        }
        pvVar5 = lj_mem_newgco((lua_State *)in_stack_ffffffffffffffa0,
                               (MSize)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        *(undefined1 *)((long)pvVar5 + 5) = 10;
        *(undefined2 *)((long)pvVar5 + 6) = local_6c;
        in_stack_ffffffffffffffa0 = (LexState *)((long)pvVar5 + 8);
        (L_00->nextgc).gcptr32 = (uint32_t)pvVar5;
        uVar2 = bcread_uleb128(in_RDI);
        *(uint32_t *)&in_stack_ffffffffffffffa0->fs = uVar2;
        uVar2 = bcread_uleb128(in_RDI);
        *(uint32_t *)((long)&in_stack_ffffffffffffffa0->fs + 4) = uVar2;
        if (uVar1 == 4) {
          uVar1 = bcread_uleb128(in_RDI);
          *(uint32_t *)&in_stack_ffffffffffffffa0->L = uVar1;
          uVar1 = bcread_uleb128(in_RDI);
          *(uint32_t *)((long)&in_stack_ffffffffffffffa0->L + 4) = uVar1;
        }
      }
    }
    else {
      len_00 = uVar1 - 5;
      lenx = bcread_mem(in_RDI,len_00);
      pGVar3 = lj_str_new(L_00,(char *)CONCAT44(uVar1,len_00),(size_t)lenx);
      (L_00->nextgc).gcptr32 = (uint32_t)pGVar3;
    }
    L_00 = (lua_State *)&L_00->marked;
  }
  return;
}

Assistant:

static void bcread_kgc(LexState *ls, GCproto *pt, MSize sizekgc)
{
  MSize i;
  GCRef *kr = mref(pt->k, GCRef) - (ptrdiff_t)sizekgc;
  for (i = 0; i < sizekgc; i++, kr++) {
    MSize tp = bcread_uleb128(ls);
    if (tp >= BCDUMP_KGC_STR) {
      MSize len = tp - BCDUMP_KGC_STR;
      const char *p = (const char *)bcread_mem(ls, len);
      setgcref(*kr, obj2gco(lj_str_new(ls->L, p, len)));
    } else if (tp == BCDUMP_KGC_TAB) {
      setgcref(*kr, obj2gco(bcread_ktab(ls)));
#if LJ_HASFFI
    } else if (tp != BCDUMP_KGC_CHILD) {
      CTypeID id = tp == BCDUMP_KGC_COMPLEX ? CTID_COMPLEX_DOUBLE :
		   tp == BCDUMP_KGC_I64 ? CTID_INT64 : CTID_UINT64;
      CTSize sz = tp == BCDUMP_KGC_COMPLEX ? 16 : 8;
      GCcdata *cd = lj_cdata_new_(ls->L, id, sz);
      TValue *p = (TValue *)cdataptr(cd);
      setgcref(*kr, obj2gco(cd));
      p[0].u32.lo = bcread_uleb128(ls);
      p[0].u32.hi = bcread_uleb128(ls);
      if (tp == BCDUMP_KGC_COMPLEX) {
	p[1].u32.lo = bcread_uleb128(ls);
	p[1].u32.hi = bcread_uleb128(ls);
      }
#endif
    } else {
      lua_State *L = ls->L;
      lua_assert(tp == BCDUMP_KGC_CHILD);
      if (L->top <= bcread_oldtop(L, ls))  /* Stack underflow? */
	bcread_error(ls, LJ_ERR_BCBAD);
      L->top--;
      setgcref(*kr, obj2gco(protoV(L->top)));
    }
  }
}